

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_truncated_tree_fix_tree_index_impl.h
# Opt level: O3

double __thiscall
ted::
TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
::tree_dist(TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  BandMatrix<double> *this_00;
  longlong *plVar1;
  pointer piVar2;
  bool bVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined4 in_register_0000000c;
  int iVar10;
  int iVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *pTVar15;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  pointer piVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  vector<int,_std::allocator<int>_> nodes_to_traverse;
  int local_13c;
  TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *local_138;
  TreeIndexAll *local_130;
  vector<int,_std::allocator<int>_> local_128;
  double local_108;
  undefined8 uStack_100;
  long local_f0;
  long local_e8;
  ulong local_e0;
  ulong local_d8;
  long local_d0;
  uint local_c8;
  int local_c4;
  ulong local_c0;
  ulong local_b8;
  TreeIndexAll *local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  int *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  Matrix<double> *local_68;
  size_t local_60;
  ulong local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_e0 = CONCAT44(in_register_0000000c,x);
  uVar20 = (ulong)x;
  local_108 = (double)CONCAT44(local_108._4_4_,
                               (t1->super_PostLToSize).postl_to_size_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar20]);
  local_e8 = CONCAT44(local_e8._4_4_,y);
  local_a8 = (long)y;
  iVar13 = (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[local_a8];
  this_00 = &(this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .fd_;
  local_c4 = k;
  local_b0 = t2;
  pdVar7 = data_structures::Matrix<double>::at
                     (&this_00->super_Matrix<double>,0,
                      (this->
                      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      ).
                      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      .fd_.band_width_);
  *pdVar7 = 0.0;
  iVar16 = e;
  if (iVar13 < e) {
    iVar16 = iVar13;
  }
  local_f0 = (long)iVar13;
  if (0 < iVar16) {
    uVar17 = 1;
    do {
      pdVar7 = data_structures::Matrix<double>::read_at
                         (&this_00->super_Matrix<double>,0,
                          (uVar17 + (this->
                                    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    ).
                                    super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    .fd_.band_width_) - 1);
      dVar25 = *pdVar7;
      pdVar7 = data_structures::Matrix<double>::at
                         (&this_00->super_Matrix<double>,0,
                          (this->
                          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ).
                          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          .fd_.band_width_ + uVar17);
      *pdVar7 = dVar25 + 1.0;
      uVar17 = uVar17 + 1;
    } while (iVar16 + 1 != uVar17);
  }
  local_138 = this;
  if (e < (int)local_f0) {
    pdVar7 = data_structures::Matrix<double>::at
                       (&this_00->super_Matrix<double>,0,
                        (long)e + (this->
                                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  ).
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  .fd_.band_width_ + 1);
    *pdVar7 = INFINITY;
  }
  pTVar15 = local_138;
  iVar13 = e;
  if (local_108._0_4_ < e) {
    iVar13 = local_108._0_4_;
  }
  if (0 < iVar13) {
    sVar12 = 1;
    do {
      pdVar7 = data_structures::Matrix<double>::read_at
                         (&this_00->super_Matrix<double>,sVar12 - 1,
                          (pTVar15->
                          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ).
                          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          .fd_.band_width_ - (sVar12 - 1));
      dVar25 = *pdVar7;
      pdVar7 = data_structures::Matrix<double>::at
                         (&this_00->super_Matrix<double>,sVar12,
                          (pTVar15->
                          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ).
                          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          .fd_.band_width_ - sVar12);
      *pdVar7 = dVar25 + 1.0;
      sVar12 = sVar12 + 1;
    } while (sVar12 != iVar13 + 1);
  }
  if (e < local_108._0_4_) {
    pdVar7 = data_structures::Matrix<double>::at
                       (&this_00->super_Matrix<double>,(long)(e + 1),
                        (local_138->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_ - (long)(e + 1));
    *pdVar7 = INFINITY;
  }
  pTVar15 = local_138;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  piVar21 = (t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((uVar20 < (ulong)((long)(t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar21 >> 2)) &&
     (piVar2 = (t1->super_PostLToDepth).postl_to_depth_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,
     uVar20 < (ulong)((long)(t1->super_PostLToDepth).postl_to_depth_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2))) {
    local_d8 = (ulong)(uint)(x - local_108._0_4_);
    local_b8 = (ulong)(e + 1U);
    iVar13 = piVar2[uVar20] + e + 1U;
    local_130 = t1;
    local_c0 = uVar20;
    if (iVar13 < piVar21[uVar20]) {
      if (0 < local_108._0_4_) {
        iVar16 = 1;
        do {
          uVar20 = (ulong)((int)local_d8 + (local_108._0_4_ - iVar16) + 1);
          piVar21 = (local_130->super_PostLToDepth).postl_to_depth_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          if ((ulong)((long)(local_130->super_PostLToDepth).postl_to_depth_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar21 >> 2) <= uVar20)
          goto LAB_00104e6e;
          local_13c = (local_108._0_4_ - iVar16) + 1;
          iVar11 = piVar21[uVar20];
          if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_128,
                       (iterator)
                       local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_13c);
          }
          else {
            *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_13c;
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar10 = 1;
          if (iVar11 == iVar13) {
            piVar21 = (local_130->super_PostLToSize).postl_to_size_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            if ((ulong)((long)(local_130->super_PostLToSize).postl_to_size_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar21 >> 2) <= uVar20)
            goto LAB_00104e6e;
            iVar10 = piVar21[uVar20];
          }
          iVar16 = iVar16 + iVar10;
          pTVar15 = local_138;
        } while (iVar16 <= local_108._0_4_);
      }
    }
    else {
      local_13c = local_108._0_4_;
      if (0 < local_108._0_4_) {
        iVar13 = local_108._0_4_;
        do {
          if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_13c = iVar13;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_128,
                       (iterator)
                       local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_13c);
          }
          else {
            *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = iVar13;
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
            local_13c = iVar13;
          }
          iVar13 = local_13c + -1;
          bVar3 = 1 < local_13c;
          local_13c = iVar13;
        } while (bVar3);
      }
    }
    local_48 = (double)e;
    uStack_40 = 0;
    lVar14 = local_f0;
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_98 = (ulong)(uint)~e;
      local_68 = &(pTVar15->
                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  ).
                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  .td_.super_Matrix<double>;
      local_a0 = (ulong)((int)local_d8 - 1);
      local_70 = (ulong)(uint)((int)local_e8 - (int)local_f0);
      local_e0 = (ulong)(uint)((((int)local_e0 + (int)local_f0) - local_108._0_4_) - (int)local_e8);
      piVar21 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        iVar13 = piVar21[-1];
        sVar12 = (size_t)iVar13;
        if (e - iVar13 < -1) {
          pdVar7 = data_structures::Matrix<double>::at
                             (&this_00->super_Matrix<double>,sVar12,
                              ((long)((int)local_98 + iVar13) - sVar12) +
                              (pTVar15->
                              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              ).
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              .fd_.band_width_);
          *pdVar7 = INFINITY;
        }
        uVar5 = iVar13 - e;
        if ((int)uVar5 < 2) {
          uVar5 = 1;
        }
        local_c8 = e + iVar13;
        uVar19 = local_c8;
        if ((int)(uint)lVar14 < (int)local_c8) {
          uVar19 = (uint)lVar14;
        }
        local_88 = piVar21;
        if ((int)uVar5 <= (int)uVar19) {
          local_60 = (size_t)((int)local_d8 + iVar13);
          local_90 = (ulong)((int)local_a0 + iVar13);
          local_78 = (ulong)(iVar13 - 1);
          uVar17 = (ulong)uVar5;
          local_58 = (ulong)uVar19;
          uVar20 = (ulong)(uVar19 + 1);
          local_e8 = -sVar12;
          iVar16 = ((int)local_e0 + iVar13) - uVar5;
          local_80 = -local_78;
          do {
            if ((iVar13 == local_108._0_4_) && (local_58 == uVar17)) break;
            plVar1 = &(pTVar15->
                      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      ).
                      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      .
                      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      .subproblem_counter_;
            *plVar1 = *plVar1 + 1;
            iVar11 = -iVar16;
            if (0 < iVar16) {
              iVar11 = iVar16;
            }
            sVar18 = (pTVar15->
                     super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                     ).
                     super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                     .fd_.band_width_;
            if (local_c4 < iVar11) {
              pdVar7 = data_structures::Matrix<double>::at
                                 (&this_00->super_Matrix<double>,sVar12,sVar18 + local_e8 + uVar17);
              *pdVar7 = INFINITY;
            }
            else {
              local_d0 = local_e8 + uVar17;
              pdVar7 = data_structures::Matrix<double>::read_at
                                 (&this_00->super_Matrix<double>,sVar12,(sVar18 - 1) + local_d0);
              sVar18 = local_60;
              lVar14 = (long)((int)local_70 + (int)uVar17);
              local_50 = *pdVar7 + 1.0;
              if (INFINITY <= local_50) {
                local_50 = INFINITY;
              }
              pdVar7 = data_structures::Matrix<double>::read_at
                                 (local_68,local_60,
                                  (lVar14 - local_60) +
                                  (local_138->
                                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  ).
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  .td_.band_width_);
              pTVar15 = local_138;
              dVar25 = *pdVar7;
              iVar11 = (local_130->super_PostLToSize).postl_to_size_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[sVar18];
              uVar5 = (local_b0->super_PostLToSize).postl_to_size_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar14];
              if ((iVar13 != iVar11) || (dVar22 = 0.0, uVar17 != uVar5)) {
                uVar8 = -uVar5 + uVar17;
                iVar10 = ~(e + iVar11) + iVar13;
                if (iVar10 < 1) {
                  iVar10 = 0;
                }
                dVar22 = INFINITY;
                iVar6 = (int)uVar8;
                if (iVar10 <= iVar6) {
                  iVar11 = iVar13 - iVar11;
                  iVar10 = (int)local_b8 + iVar11;
                  if ((int)local_f0 < iVar10) {
                    iVar10 = (int)local_f0;
                  }
                  dVar22 = INFINITY;
                  if (iVar6 <= iVar10) {
                    pdVar7 = data_structures::Matrix<double>::read_at
                                       (&this_00->super_Matrix<double>,(long)iVar11,
                                        ((uVar8 & 0xffffffff) - (long)iVar11) +
                                        (local_138->
                                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                        ).
                                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                        .fd_.band_width_);
                    dVar22 = *pdVar7;
                  }
                }
              }
              dVar23 = dVar25 + dVar22;
              if (local_50 <= dVar25 + dVar22) {
                dVar23 = local_50;
              }
              dVar25 = dVar23;
              if (iVar13 == 1) {
LAB_00104bee:
                pdVar7 = data_structures::Matrix<double>::read_at
                                   (&this_00->super_Matrix<double>,local_78,
                                    local_80 + uVar17 +
                                    (pTVar15->
                                    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    ).
                                    super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    .fd_.band_width_);
                dVar25 = *pdVar7 + 1.0;
                if (dVar23 <= *pdVar7 + 1.0) {
                  dVar25 = dVar23;
                }
              }
              else if (1 < iVar13) {
                piVar21 = (local_130->super_PostLToDepth).postl_to_depth_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if ((ulong)((long)(local_130->super_PostLToDepth).postl_to_depth_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar21 >> 2) <=
                    local_90) {
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_00104e6e;
                }
                if (piVar21[local_90] - piVar21[local_c0] <= (int)local_b8) goto LAB_00104bee;
              }
              sVar18 = local_d0 +
                       (pTVar15->
                       super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       ).
                       super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       .fd_.band_width_;
              if (dVar25 <= local_48) {
                pdVar7 = data_structures::Matrix<double>::at
                                   (&this_00->super_Matrix<double>,sVar12,sVar18);
                *pdVar7 = dVar25;
              }
              else {
                pdVar7 = data_structures::Matrix<double>::at
                                   (&this_00->super_Matrix<double>,sVar12,sVar18);
                *pdVar7 = INFINITY;
              }
            }
            uVar17 = uVar17 + 1;
            iVar16 = iVar16 + -1;
          } while (uVar20 != uVar17);
        }
        piVar4 = local_88;
        lVar14 = local_f0;
        if ((int)local_c8 < (int)local_f0) {
          pdVar7 = data_structures::Matrix<double>::at
                             (&this_00->super_Matrix<double>,sVar12,
                              ((long)(int)(local_c8 + 1) - sVar12) +
                              (pTVar15->
                              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              ).
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              .fd_.band_width_);
          *pdVar7 = INFINITY;
        }
        piVar21 = piVar4 + -1;
      } while (piVar21 !=
               local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    sVar18 = (size_t)local_108._0_4_;
    plVar1 = &(pTVar15->
              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              ).
              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .
              super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .subproblem_counter_;
    *plVar1 = *plVar1 + 1;
    sVar12 = sVar18 - 1;
    pdVar7 = data_structures::Matrix<double>::read_at
                       (&this_00->super_Matrix<double>,sVar12,
                        (lVar14 - sVar12) +
                        (pTVar15->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_);
    dVar25 = *pdVar7;
    pdVar7 = data_structures::Matrix<double>::read_at
                       (&this_00->super_Matrix<double>,sVar18,
                        ((lVar14 + -1) - sVar18) +
                        (pTVar15->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_);
    dVar22 = *pdVar7;
    pdVar7 = data_structures::Matrix<double>::read_at
                       (&this_00->super_Matrix<double>,sVar12,
                        ((lVar14 + -1) - sVar12) +
                        (pTVar15->
                        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        .fd_.band_width_);
    local_108 = *pdVar7;
    iVar13 = (local_130->super_PostLToLabelId).postl_to_label_id_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [local_c0];
    iVar16 = (local_b0->super_PostLToLabelId).postl_to_label_id_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [local_a8];
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      uStack_100 = 0;
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar23 = 0.0;
    if (iVar13 != iVar16) {
      dVar23 = 1.0;
    }
    dVar24 = dVar22 + 1.0;
    if (dVar25 + 1.0 <= dVar22 + 1.0) {
      dVar24 = dVar25 + 1.0;
    }
    dVar25 = local_108 + dVar23;
    if (dVar24 <= local_108 + dVar23) {
      dVar25 = dVar24;
    }
    return (double)(-(ulong)(local_48 < dVar25) & 0x7ff0000000000000 |
                   ~-(ulong)(local_48 < dVar25) & (ulong)dVar25);
  }
LAB_00104e7f:
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar20);
  if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar9);
LAB_00104e6e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
  goto LAB_00104e7f;
}

Assistant:

double TouzetDepthPruningTruncatedTreeFixTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];

  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = 0;

  // Collect all nodes in truncated tree to traverse.
  std::vector<int> nodes_to_traverse; // Normalized to current subtree: 1..|x|.
  // NOTE: If we can't truncate anything, all the nodes from the subtree have
  //       to be traversed.
  if (t1.postl_to_subtree_max_depth_.at(x) <= t1.postl_to_depth_.at(x) + e + 1) {
    max_depth = t1.postl_to_subtree_max_depth_.at(x);
    for (int n = x_size; n >= 1; --n) {
      nodes_to_traverse.push_back(n);
    }
  } else {
    max_depth = t1.postl_to_depth_.at(x) + e + 1;
    int n = 1;
    int post_n = 0;
    int depth_n = 0;
    while (n <= x_size) { // Loop in right-to-left-preorder
      post_n = x_size - n + 1 + x_off;
      depth_n = t1.postl_to_depth_.at(post_n);
      // if (depth_n <= max_depth) { // NOTE: depth_n < max_depth is always satisfied.
        nodes_to_traverse.push_back(x_size - n + 1);
        if (depth_n == max_depth) {// Jump to the next node to the left with the max_depth.
          n += t1.postl_to_size_.at(post_n);
        } else {
          ++n;
        }
      // }
    }
  }

  // Traversing truncated tree to filter out i-values based on depth.
  typename std::vector<int>::reverse_iterator rit = nodes_to_traverse.rbegin();
  int i;
  for (; rit != nodes_to_traverse.rend(); ++rit) {
    i = *rit;
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
  }

  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}